

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O2

exr_result_t
exr_encoding_initialize
          (exr_const_context_t_conflict ctxt,int part_index,exr_chunk_info_t *cinfo,
          exr_encode_pipeline_t *encode)

{
  byte bVar1;
  exr_const_priv_part_t part;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  int32_t iVar7;
  int32_t iVar8;
  int32_t iVar9;
  int32_t iVar10;
  uint8_t uVar11;
  uint8_t uVar12;
  uint8_t uVar13;
  uint8_t uVar14;
  exr_result_t eVar15;
  _func_exr_result_t_exr_const_context_t_exr_result_t *UNRECOVERED_JUMPTABLE;
  exr_context_t nonc;
  exr_result_t eStack_30;
  
  if (ctxt == (exr_const_context_t_conflict)0x0) {
    return 2;
  }
  if (ctxt->mode == '\x01') {
    pthread_mutex_lock((pthread_mutex_t *)&ctxt->mutex);
  }
  if ((-1 < part_index) && (part_index < ctxt->num_parts)) {
    bVar1 = ctxt->mode;
    if (cinfo == (exr_chunk_info_t *)0x0 || encode == (exr_encode_pipeline_t *)0x0) {
      if (bVar1 == 1) {
        pthread_mutex_unlock((pthread_mutex_t *)&ctxt->mutex);
      }
      UNRECOVERED_JUMPTABLE = ctxt->standard_error;
      eStack_30 = 3;
    }
    else {
      if (bVar1 - 3 < 2) {
        part = ctxt->parts[(uint)part_index];
        memset(encode,0,0x200);
        eVar15 = internal_coding_fill_channel_info
                           (&encode->channels,&encode->channel_count,encode->_quick_chan_store,cinfo
                            ,ctxt,part);
        if (eVar15 == 0) {
          encode->part_index = part_index;
          encode->context = ctxt;
          iVar7 = cinfo->start_x;
          iVar8 = cinfo->start_y;
          iVar9 = cinfo->height;
          iVar10 = cinfo->width;
          uVar11 = cinfo->level_x;
          uVar12 = cinfo->level_y;
          uVar13 = cinfo->type;
          uVar14 = cinfo->compression;
          uVar2 = cinfo->data_offset;
          uVar3 = cinfo->packed_size;
          uVar4 = cinfo->unpacked_size;
          uVar5 = cinfo->sample_count_data_offset;
          uVar6 = cinfo->sample_count_table_size;
          (encode->chunk).idx = cinfo->idx;
          (encode->chunk).start_x = iVar7;
          (encode->chunk).start_y = iVar8;
          (encode->chunk).height = iVar9;
          (encode->chunk).width = iVar10;
          (encode->chunk).level_x = uVar11;
          (encode->chunk).level_y = uVar12;
          (encode->chunk).type = uVar13;
          (encode->chunk).compression = uVar14;
          (encode->chunk).data_offset = uVar2;
          (encode->chunk).packed_size = uVar3;
          (encode->chunk).unpacked_size = uVar4;
          (encode->chunk).sample_count_data_offset = uVar5;
          (encode->chunk).sample_count_table_size = uVar6;
        }
        if (ctxt->mode != '\x01') {
          return eVar15;
        }
        pthread_mutex_unlock((pthread_mutex_t *)&ctxt->mutex);
        return eVar15;
      }
      if (bVar1 == 1) {
        pthread_mutex_unlock((pthread_mutex_t *)&ctxt->mutex);
        UNRECOVERED_JUMPTABLE = ctxt->standard_error;
        eStack_30 = 9;
      }
      else {
        UNRECOVERED_JUMPTABLE = ctxt->standard_error;
        eStack_30 = 8;
      }
    }
    eVar15 = (*UNRECOVERED_JUMPTABLE)(ctxt,eStack_30);
    return eVar15;
  }
  if (ctxt->mode == '\x01') {
    pthread_mutex_unlock((pthread_mutex_t *)&ctxt->mutex);
  }
  eVar15 = (*ctxt->print_error)
                     (ctxt,4,"Part index (%d) out of range",(ulong)(uint)part_index,
                      ctxt->print_error);
  return eVar15;
}

Assistant:

exr_result_t
exr_encoding_initialize (
    exr_const_context_t     ctxt,
    int                     part_index,
    const exr_chunk_info_t* cinfo,
    exr_encode_pipeline_t*  encode)
{
    exr_result_t          rv;
    exr_encode_pipeline_t nil = {0};

    EXR_LOCK_WRITE_AND_DEFINE_PART (part_index);
    if (!cinfo || !encode)
        return EXR_UNLOCK_WRITE_AND_RETURN (
            ctxt->standard_error (ctxt, EXR_ERR_INVALID_ARGUMENT));

    if (ctxt->mode != EXR_CONTEXT_WRITING_DATA &&
        ctxt->mode != EXR_CONTEXT_TEMPORARY)
    {
        if (ctxt->mode == EXR_CONTEXT_WRITE)
            return EXR_UNLOCK_WRITE_AND_RETURN (
                ctxt->standard_error (ctxt, EXR_ERR_HEADER_NOT_WRITTEN));
        return EXR_UNLOCK_WRITE_AND_RETURN (
            ctxt->standard_error (ctxt, EXR_ERR_NOT_OPEN_WRITE));
    }

    *encode = nil;

    rv = internal_coding_fill_channel_info (
        &(encode->channels),
        &(encode->channel_count),
        encode->_quick_chan_store,
        cinfo,
        ctxt,
        part);

    if (rv == EXR_ERR_SUCCESS)
    {
        encode->part_index = part_index;
        encode->context    = ctxt;
        encode->chunk      = *cinfo;
    }
    return EXR_UNLOCK_WRITE_AND_RETURN (rv);
}